

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  bool bVar5;
  AliasRet AVar6;
  int iVar7;
  IRIns *pIVar8;
  cTValue *pcVar9;
  IRIns *pIVar10;
  TRef unaff_EBP;
  uint uVar11;
  ulong uVar12;
  TValue keyv;
  IRRef local_54;
  uint local_40;
  TValue local_38;
  
  pIVar4 = (J->cur).ir;
  pIVar10 = pIVar4 + xref;
  uVar11 = (uint)J->chain[(ulong)(J->fold).ins.field_1.o + 8];
  local_54 = xref;
  do {
    if (uVar11 <= xref) {
      pIVar8 = pIVar10;
      if (((pIVar10->field_1).o & 0xfe) == 0x38) {
        pIVar8 = pIVar4 + (pIVar10->field_0).op1;
      }
      uVar3 = (pIVar8->field_0).op1;
      cVar1 = *(char *)((long)pIVar4 + (ulong)uVar3 * 8 + 5);
      if ((cVar1 != 'Q') &&
         ((iVar7 = 0, cVar1 != 'R' || (iVar7 = 0, (short)(pIVar10->field_0).op2 < 0))))
      goto LAB_00156857;
      if ((pIVar10->field_1).o != 0x38) goto LAB_00156712;
      uVar2 = J->chain[0x3b];
      goto LAB_001566d9;
    }
    uVar12 = (ulong)uVar11;
    AVar6 = aa_ahref(J,pIVar10,pIVar4 + pIVar4[uVar12].field_0.op1);
    if (AVar6 == ALIAS_MAY) {
      iVar7 = 5;
      local_54 = uVar11;
    }
    else if (AVar6 == ALIAS_MUST) {
      unaff_EBP = (TRef)*(ushort *)((long)pIVar4 + uVar12 * 8 + 2);
      iVar7 = 1;
    }
    else {
      uVar11 = (uint)*(ushort *)((long)pIVar4 + uVar12 * 8 + 6);
      iVar7 = 0;
    }
  } while (iVar7 == 0);
  goto joined_r0x00156863;
LAB_001566d9:
  if (uVar2 <= uVar3) goto LAB_00156708;
  iVar7 = 5;
  if ((*(byte *)((long)pIVar4 + (ulong)*(ushort *)((long)pIVar4 + (ulong)uVar2 * 8 + 2) * 8 + 4) &
      0x1f) == 0xe) goto LAB_0015670a;
  uVar2 = *(ushort *)((long)pIVar4 + (ulong)uVar2 * 8 + 6);
  goto LAB_001566d9;
LAB_00156708:
  iVar7 = 0;
LAB_0015670a:
  if (iVar7 == 0) {
LAB_00156712:
    do {
      local_40 = (uint)uVar3;
      if (uVar11 <= local_40) {
        if ((cVar1 == 'Q') && (((J->fold).ins.field_1.t.irt & 0x1f) != 0)) {
          unaff_EBP = 0;
        }
        else {
          uVar11 = (J->fold).ins.field_1.t.irt & 0x1f;
          if ((byte)uVar11 < 3) {
            unaff_EBP = (uVar11 << 0x18 | uVar11) ^ 0x7fff;
          }
          else {
            if (((byte)uVar11 != 0xe) && (iVar7 = 0, uVar11 != 4)) break;
            pIVar10 = pIVar4 + (pIVar10->field_0).op2;
            if ((pIVar10->field_1).o == '\x1e') {
              pIVar10 = pIVar4 + (pIVar10->field_0).op1;
            }
            lj_ir_kvalue(J->L,&local_38,pIVar10);
            pcVar9 = lj_tab_get(J->L,(GCtab *)(J->cur).ir[(ulong)pIVar4[uVar3].field_0.op1 + 1],
                                &local_38);
            if (((J->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
              unaff_EBP = lj_ir_knum_u64(J,pcVar9->u64);
            }
            else {
              unaff_EBP = lj_ir_kgc(J,(GCobj *)(pcVar9->u64 & 0x7fffffffffff),IRT_STR);
            }
          }
        }
        iVar7 = 1;
        break;
      }
      uVar12 = (ulong)uVar11;
      AVar6 = aa_ahref(J,pIVar10,pIVar4 + pIVar4[uVar12].field_0.op1);
      if (AVar6 == ALIAS_MAY) {
        iVar7 = 5;
LAB_00156756:
        bVar5 = false;
      }
      else {
        if (AVar6 == ALIAS_MUST) {
          unaff_EBP = (TRef)*(ushort *)((long)pIVar4 + uVar12 * 8 + 2);
          iVar7 = 1;
          goto LAB_00156756;
        }
        uVar11 = (uint)*(ushort *)((long)pIVar4 + uVar12 * 8 + 6);
        iVar7 = 0;
        bVar5 = true;
      }
    } while (bVar5);
  }
LAB_00156857:
  if (iVar7 == 0) goto LAB_0015686c;
joined_r0x00156863:
  if (iVar7 != 5) {
    return unaff_EBP;
  }
LAB_0015686c:
  uVar3 = J->chain[(J->fold).ins.field_1.o];
  while( true ) {
    uVar11 = (uint)uVar3;
    if (uVar11 <= local_54) {
      return 0;
    }
    pIVar10 = (J->cur).ir;
    if (pIVar10[uVar11].field_0.op1 == xref) break;
    uVar3 = *(ushort *)((long)pIVar10 + (ulong)uVar11 * 8 + 6);
  }
  return uVar11;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      if (ir->o == IR_TNEW && !irt_isnil(fins->t))
	return 0;  /* Type instability in loop-carried dependency. */
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lj_assertJ(itype2irt(tv) == irt_type(fins->t),
		   "mismatched type in constant table");
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}